

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc.c
# Opt level: O1

void sc_data_init(sc_data_t *sc_data)

{
  _Bool _Var1;
  int index;
  size_t sVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  sc_t *psVar7;
  ulong uVar8;
  int lg_base;
  undefined8 in_R9;
  int iVar9;
  size_t sVar10;
  int iVar11;
  size_t sVar12;
  ulong uVar13;
  int lg_ngroup;
  long lVar14;
  int in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  long lVar15;
  
  sc_data->sc[0].index = 0;
  sc_data->sc[0].lg_base = 3;
  sc_data->sc[0].lg_delta = 3;
  sc_data->sc[0].ndelta = 0;
  sc_data->sc[0].psz = false;
  sc_data->sc[0].bin = true;
  sc_data->sc[0].pgs = 1;
  sc_data->sc[0].lg_delta_lookup = 3;
  sc_data->sc[1].index = 1;
  sc_data->sc[1].lg_base = 3;
  sc_data->sc[1].lg_delta = 3;
  sc_data->sc[1].ndelta = 1;
  sc_data->sc[1].psz = false;
  sc_data->sc[1].bin = true;
  sc_data->sc[1].pgs = 1;
  sc_data->sc[1].lg_delta_lookup = 3;
  psVar7 = sc_data->sc + 2;
  uVar6 = 0;
  iVar11 = 2;
  lVar5 = -3;
  do {
    size_class(psVar7,(int)lVar5 + 5,4,4,(int)lVar5 + 4,(int)in_R9,in_stack_ffffffffffffff68,
               (int)in_stack_ffffffffffffff70);
    uVar6 = uVar6 + psVar7->psz;
    iVar11 = iVar11 + (uint)psVar7->bin;
    psVar7 = psVar7 + 1;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0);
  lg_base = 0;
  lVar3 = 5;
  iVar9 = 1;
  lg_ngroup = 4;
  sVar10 = 0;
  sVar12 = 0;
  lVar5 = 6;
  do {
    uVar13 = 1;
    lVar15 = lVar5 + 1;
    iVar4 = (int)lVar3;
    uVar8 = (ulong)(lVar5 == 0x3e) ^ 5;
    lVar14 = lVar3 << 0x20;
    psVar7 = sc_data->sc + iVar4;
    do {
      index = (int)uVar13;
      size_class(psVar7,iVar4 + -1 + index,(int)lVar5,lg_ngroup,index,lg_base,
                 in_stack_ffffffffffffff68,(int)lVar15);
      sVar2 = (uVar13 << ((byte)lg_ngroup & 0x3f)) + (1L << ((byte)lVar5 & 0x3f));
      if (psVar7->lg_delta_lookup != 0) {
        iVar9 = iVar4 + index;
        sVar12 = sVar2;
      }
      uVar6 = uVar6 + psVar7->psz;
      _Var1 = psVar7->bin;
      if (_Var1 != false) {
        sVar10 = sVar2;
      }
      if (_Var1 != false) {
        lg_base = (int)lVar15;
      }
      iVar11 = iVar11 + (uint)_Var1;
      uVar13 = uVar13 + 1;
      lVar14 = lVar14 + 0x100000000;
      psVar7 = psVar7 + 1;
    } while (uVar8 != uVar13);
    lg_ngroup = lg_ngroup + 1;
    lVar3 = (long)iVar4 + uVar13 + -1;
    lVar5 = lVar15;
  } while (lVar15 != 0x3f);
  uVar13 = lVar14 >> 0x20;
  lVar5 = 0x3f;
  if (uVar13 != 0) {
    for (; uVar13 >> lVar5 == 0; lVar5 = lVar5 + -1) {
    }
  }
  sc_data->ntiny = 1;
  sc_data->nlbins = iVar9;
  sc_data->nbins = iVar11;
  sc_data->nsizes = (int)uVar8 + iVar4 + -1;
  sc_data->lg_ceil_nsizes = ((int)lVar5 + 1) - (uint)((uVar13 - 1 & uVar13) == 0);
  sc_data->npsizes = uVar6;
  sc_data->lg_tiny_maxclass = 3;
  sc_data->lookup_maxclass = sVar12;
  sc_data->small_maxclass = sVar10;
  sc_data->lg_large_minclass = lg_base;
  sc_data->large_minclass = 1L << ((byte)lg_base & 0x3f);
  sc_data->large_maxclass = sVar2;
  sc_data->initialized = true;
  return;
}

Assistant:

void
sc_data_init(sc_data_t *sc_data) {
	assert(!sc_data->initialized);

	int lg_max_lookup = 12;

	size_classes(sc_data, LG_SIZEOF_PTR, LG_QUANTUM, SC_LG_TINY_MIN,
	    lg_max_lookup, LG_PAGE, 2);

	sc_data->initialized = true;
}